

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O3

string * sha256(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  int i;
  long lVar2;
  char cdigest [64];
  char digest [32];
  sha256_context ctx;
  byte local_e8 [104];
  sha256_context local_80;
  
  sha256_start(&local_80);
  sha256_update(&local_80,(str->_M_dataplus)._M_p,str->_M_string_length);
  sha256_finish(&local_80,(char *)(local_e8 + 0x40));
  lVar2 = 0;
  do {
    bVar1 = local_e8[lVar2 + 0x40];
    local_e8[lVar2 * 2] = "0123456789abcdef"[bVar1 >> 4];
    local_e8[lVar2 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_e8,local_e8 + 0x40);
  return __return_storage_ptr__;
}

Assistant:

std::string sha256(const std::string& str)
{
	sha256_context ctx;
	char digest[32];
	char cdigest[64];

	sha256_start(&ctx);
	sha256_update(&ctx, str.c_str(), str.length());
	sha256_finish(&ctx, digest);

	for (int i = 0; i < 32; ++i)
	{
		cdigest[i*2]   = "0123456789abcdef"[((digest[i] >> 4) & 0x0F)];
		cdigest[i*2+1] = "0123456789abcdef"[((digest[i]) & 0x0F)];
	}

	return std::string(cdigest, 64);
}